

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::Arg::parse(Arg *this,string *param_2,TokenStream *tokens)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  BasicResult<Catch::clara::detail::ParseState> *this_00;
  Token *pTVar4;
  long *in_RSI;
  InternalParseResult *in_RDI;
  long in_FS_OFFSET;
  BoundValueRefBase *valueRef;
  Token *token;
  TokenStream remainingTokens;
  ParserResult result;
  Result validationResult;
  undefined4 in_stack_fffffffffffffe68;
  ParseResultType in_stack_fffffffffffffe6c;
  ParseState *in_stack_fffffffffffffe70;
  BasicResult<Catch::clara::detail::ParseResultType> *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  InternalParseResult *this_01;
  BasicResult local_90 [48];
  int local_60;
  BasicResult local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  (**(code **)(*in_RSI + 0x10))(local_38);
  bVar1 = BasicResult::operator_cast_to_bool(local_38);
  if (bVar1) {
    TokenStream::TokenStream
              ((TokenStream *)in_stack_fffffffffffffe70,
               (TokenStream *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    TokenStream::operator*((TokenStream *)in_stack_fffffffffffffe78);
    if (local_60 == 1) {
      peVar3 = std::
               __shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x285224);
      iVar2 = (*peVar3->_vptr_BoundRef[3])();
      if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
        __assert_fail("!m_ref->isFlag()",
                      "/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp"
                      ,0x248c,
                      "virtual InternalParseResult Catch::clara::detail::Arg::parse(const std::string &, const TokenStream &) const"
                     );
      }
      this_00 = (BasicResult<Catch::clara::detail::ParseState> *)
                std::__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>
                            *)(in_RSI + 2));
      pTVar4 = TokenStream::operator->((TokenStream *)in_stack_fffffffffffffe70);
      (*(this_00->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.
        _vptr_ResultBase[4])(local_90,this_00,&pTVar4->token);
      bVar1 = BasicResult::operator_cast_to_bool(local_90);
      if (bVar1) {
        TokenStream::operator++((TokenStream *)this_01);
        ParseState::ParseState
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,(TokenStream *)0x28531c);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                  ((ParseState *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        ParseState::~ParseState((ParseState *)0x285339);
      }
      else {
        BasicResult<Catch::clara::detail::ParseState>::
        BasicResult<Catch::clara::detail::ParseResultType>(this_00,in_stack_fffffffffffffe78);
      }
      BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
                ((BasicResult<Catch::clara::detail::ParseResultType> *)in_stack_fffffffffffffe70);
    }
    else {
      ParseState::ParseState
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,(TokenStream *)0x285194);
      BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                ((ParseState *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      ParseState::~ParseState((ParseState *)0x2851b1);
    }
    Token::~Token((Token *)0x285391);
    TokenStream::~TokenStream((TokenStream *)0x28539e);
  }
  else {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (this_01,(BasicResult<void> *)
                       CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  }
  BasicResult<void>::~BasicResult((BasicResult<void> *)in_stack_fffffffffffffe70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

auto parse( std::string const &, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            auto const &token = *remainingTokens;
            if( token.type != TokenType::Argument )
                return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );

            assert( !m_ref->isFlag() );
            auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );

            auto result = valueRef->setValue( remainingTokens->token );
            if( !result )
                return InternalParseResult( result );
            else
                return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
        }